

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

Integer compare_patches_(Integer *me,double *eps,Integer *ndim,double *array1,Integer *LO1,
                        Integer *HI1,Integer *DIMS1,double *array2,Integer *LO2,Integer *HI2,
                        Integer *DIMS2)

{
  int iVar1;
  undefined8 *in_RDX;
  Integer *in_R8;
  Integer *in_R9;
  Integer *in_stack_00000008;
  Integer *in_stack_00000018;
  int dims2 [7];
  int lo2 [7];
  int hi2 [7];
  int dims1 [7];
  int lo1 [7];
  int hi1 [7];
  int local_f8 [8];
  int local_d8 [8];
  int local_b8 [8];
  int local_98 [8];
  int local_78 [8];
  int local_58 [10];
  Integer *local_30;
  undefined8 *local_20;
  
  if ((int)*in_RDX < 8) {
    local_30 = in_R8;
    local_20 = in_RDX;
    f2c_adj_indices(in_R9,local_58,(int)*in_RDX);
    f2c_adj_indices((Integer *)dims2._0_8_,local_b8,(int)*local_20);
    f2c_adj_indices(local_30,local_78,(int)*local_20);
    f2c_adj_indices(in_stack_00000018,local_d8,(int)*local_20);
    f2c_copy_indices(in_stack_00000008,local_98,(int)*local_20);
    f2c_copy_indices((Integer *)dims2._8_8_,local_f8,(int)*local_20);
    iVar1 = compare_patches_internal
                      (hi2[0],stack0x00000058,lo2[5],(double *)lo2._8_8_,(int *)lo2._0_8_,
                       stack0x00000038,(int *)dims2._16_8_,(double *)hi2._16_8_,stack0x00000078,
                       (int *)dims1._0_8_,(int *)dims1._8_8_);
    return (long)iVar1;
  }
  __assert_fail("(int)*ndim <= GA_MAX_DIM",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                ,0x122,
                "Integer compare_patches_(Integer *, double *, Integer *, double *, Integer *, Integer *, Integer *, double *, Integer *, Integer *, Integer *)"
               );
}

Assistant:

Integer FATR compare_patches_(Integer *me,
                     double* eps, Integer *ndim, double *array1,    
                     Integer LO1[], Integer HI1[], Integer DIMS1[],
                     double *array2, Integer LO2[], Integer HI2[],
                     Integer DIMS2[])
{
int hi1[GA_MAX_DIM], lo1[GA_MAX_DIM], dims1[GA_MAX_DIM]; 
int hi2[GA_MAX_DIM], lo2[GA_MAX_DIM], dims2[GA_MAX_DIM]; 

    assert((int)*ndim <= GA_MAX_DIM);

    f2c_adj_indices(HI1, hi1, (int)*ndim);
    f2c_adj_indices(HI2, hi2, (int)*ndim);
    f2c_adj_indices(LO1, lo1, (int)*ndim);
    f2c_adj_indices(LO2, lo2, (int)*ndim);
    f2c_copy_indices(DIMS1, dims1, (int)*ndim);
    f2c_copy_indices(DIMS2, dims2, (int)*ndim);

    return (Integer) compare_patches_internal((int)*me, *eps, (int)*ndim, 
                     array1, lo1, hi1, dims1, array2, lo2, hi2, dims2);
}